

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

wchar_t best_effort_strncat_in_locale
                  (archive_string *as,void *_p,size_t length,archive_string_conv *sc)

{
  archive_string *paVar1;
  wchar_t local_44;
  byte *pbStack_40;
  wchar_t return_value;
  uint8_t *itp;
  size_t remaining;
  archive_string_conv *sc_local;
  size_t length_local;
  void *_p_local;
  archive_string *as_local;
  
  local_44 = L'\0';
  pbStack_40 = (byte *)_p;
  if (sc->same == L'\0') {
    for (; *pbStack_40 != 0 && length != 0; pbStack_40 = pbStack_40 + 1) {
      if (*pbStack_40 < 0x80) {
        archive_strappend_char(as,*pbStack_40);
      }
      else {
        if ((sc->flag & 0x100U) == 0) {
          archive_strappend_char(as,'?');
        }
        else {
          paVar1 = archive_string_append(as,utf8_replacement_char,3);
          if (paVar1 == (archive_string *)0x0) {
            __archive_errx(1,"Out of memory");
          }
        }
        local_44 = L'\xffffffff';
      }
    }
    as_local._4_4_ = local_44;
  }
  else {
    paVar1 = archive_string_append(as,(char *)_p,length);
    if (paVar1 == (archive_string *)0x0) {
      as_local._4_4_ = L'\xffffffff';
    }
    else {
      as_local._4_4_ = invalid_mbs(_p,length,sc);
    }
  }
  return as_local._4_4_;
}

Assistant:

static int
best_effort_strncat_in_locale(struct archive_string *as, const void *_p,
    size_t length, struct archive_string_conv *sc)
{
	size_t remaining;
	const uint8_t *itp;
	int return_value = 0; /* success */

	/*
	 * If both from-locale and to-locale is the same, this makes a copy.
	 * And then this checks all copied MBS can be WCS if so returns 0.
	 */
	if (sc->same) {
		if (archive_string_append(as, _p, length) == NULL)
			return (-1);/* No memory */
		return (invalid_mbs(_p, length, sc));
	}

	/*
	 * If a character is ASCII, this just copies it. If not, this
	 * assigns '?' charater instead but in UTF-8 locale this assigns
	 * byte sequence 0xEF 0xBD 0xBD, which are code point U+FFFD,
	 * a Replacement Character in Unicode.
	 */

	remaining = length;
	itp = (const uint8_t *)_p;
	while (*itp && remaining > 0) {
		if (*itp > 127) {
			// Non-ASCII: Substitute with suitable replacement
			if (sc->flag & SCONV_TO_UTF8) {
				if (archive_string_append(as, utf8_replacement_char, sizeof(utf8_replacement_char)) == NULL) {
					__archive_errx(1, "Out of memory");
				}
			} else {
				archive_strappend_char(as, '?');
			}
			return_value = -1;
		} else {
			archive_strappend_char(as, *itp);
		}
		++itp;
	}
	return (return_value);
}